

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSampleRenderCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ulong uVar1;
  ostream *poVar2;
  int ndx_1;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int ndx;
  ostringstream buf;
  ContextType local_1cc;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  if ((ulong)*(uint *)((long)this + 0xbc) < 5) {
    std::operator<<(&local_1a8,
                    &DAT_0189e974 +
                    *(int *)(&DAT_0189e974 + (ulong)*(uint *)((long)this + 0xbc) * 4));
  }
  std::operator<<(&local_1a8,"layout(location = 0) out mediump vec4 fragColor;\n");
  if (*(int *)((long)this + 0x128) == 1) {
    std::operator<<(&local_1a8,"uniform highp int u_offset;\nuniform highp int u_range;\n");
  }
  std::operator<<(&local_1a8,"void main (void)\n{\n\tmediump int coverage = 0;\n\n");
  if (*(int *)((long)this + 0x128) == 1) {
    poVar2 = std::operator<<(&local_1a8,"\tfor (int ndx = 0; ndx < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,numTargetSamples);
    std::operator<<(poVar2,"; ++ndx)\n\t{\n");
    uVar1 = (ulong)*(uint *)((long)this + 0xbc);
    if (uVar1 < 5) {
      std::operator<<(&local_1a8,&DAT_0189e988 + *(int *)(&DAT_0189e988 + uVar1 * 4));
      uVar1 = (ulong)*(uint *)((long)this + 0xbc);
    }
    if ((uint)uVar1 < 5) {
      std::operator<<(&local_1a8,&DAT_0189e99c + *(int *)(&DAT_0189e99c + uVar1 * 4));
    }
    std::operator<<(&local_1a8,"\t\tif (fract(field) <= 0.5)\n\t\t\t++coverage;\n\t}\n");
  }
  else if (*(int *)((long)this + 0x128) == 0) {
    iVar3 = 0;
    iVar4 = 0;
    if (0 < numTargetSamples) {
      iVar4 = numTargetSamples;
    }
    for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      pcVar5 = "\thighp vec2 sampleInput";
      switch(*(undefined4 *)((long)this + 0xbc)) {
      case 0:
        pcVar5 = "\thighp float sampleInput";
        break;
      case 1:
        break;
      case 2:
        pcVar5 = "\thighp vec3 sampleInput";
        break;
      case 3:
        pcVar5 = "\thighp vec4 sampleInput";
        break;
      case 4:
        poVar2 = std::operator<<(&local_1a8,"\thighp vec2 sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar5 = " = interpolateAtSample(v_input[1], ";
        goto LAB_01236a4c;
      default:
        goto switchD_012369fa_default;
      }
      poVar2 = std::operator<<(&local_1a8,pcVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      pcVar5 = " = interpolateAtSample(v_input, ";
LAB_01236a4c:
      poVar2 = std::operator<<(poVar2,pcVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      std::operator<<(poVar2,");\n");
switchD_012369fa_default:
    }
    std::operator<<(&local_1a8,"\n");
    for (iVar3 = 0; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      switch(*(undefined4 *)((long)this + 0xbc)) {
      case 0:
        poVar2 = std::operator<<(&local_1a8,"\thighp float field");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2," = exp(sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,") + sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,"*sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar5 = ";\n";
        break;
      case 1:
      case 4:
        poVar2 = std::operator<<(&local_1a8,"\thighp float field");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2," = dot(sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,", sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,") + dot(21.0 * sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".xx, sin(3.1 * sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar5 = "));\n";
        break;
      case 2:
        poVar2 = std::operator<<(&local_1a8,"\thighp float field");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2," = dot(sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".xy, sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".xy) + dot(21.0 * sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".zx, sin(3.1 * sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar5 = ".zy));\n";
        break;
      case 3:
        poVar2 = std::operator<<(&local_1a8,"\thighp float field");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2," = dot(sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".xy, sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".zw) + dot(21.0 * sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,".zy, sin(3.1 * sampleInput");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar5 = ".zw));\n";
        break;
      default:
        goto switchD_01236bd8_default;
      }
      std::operator<<(poVar2,pcVar5);
switchD_01236bd8_default:
    }
    std::operator<<(&local_1a8,"\n");
    for (iVar3 = 0; iVar4 != iVar3; iVar3 = iVar3 + 1) {
      poVar2 = std::operator<<(&local_1a8,"\tif (fract(field");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      std::operator<<(poVar2,") <= 0.5)\n\t\t++coverage;\n");
    }
  }
  poVar2 = std::operator<<(&local_1a8,"\tfragColor = vec4(vec3(float(coverage) / float(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,numTargetSamples);
  std::operator<<(poVar2,")), 1.0);\n}");
  std::__cxx11::stringbuf::str();
  local_1cc.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSampleRenderCase::genFragmentSource (int numTargetSamples) const
{
	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_iteration == 0)
		buf << "in highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "in highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "in highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "in highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "in highp vec2[2] v_input;\n";
	else
		DE_ASSERT(false);

	buf << "layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_indexMode == INDEXING_DYNAMIC)
		buf <<	"uniform highp int u_offset;\n"
				"uniform highp int u_range;\n";

	buf <<	"void main (void)\n"
			"{\n"
			"	mediump int coverage = 0;\n"
			"\n";

	if (m_indexMode == INDEXING_STATIC)
	{
		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
		{
			if (m_iteration == 0)
				buf <<	"	highp float sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 1)
				buf <<	"	highp vec2 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 2)
				buf <<	"	highp vec3 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 3)
				buf <<	"	highp vec4 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 4)
				buf <<	"	highp vec2 sampleInput" << ndx << " = interpolateAtSample(v_input[1], " << ndx << ");\n";
			else
				DE_ASSERT(false);
		}
		buf <<	"\n";

		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
		{
			if (m_iteration == 0)
				buf << "	highp float field" << ndx << " = exp(sampleInput" << ndx << ") + sampleInput" << ndx << "*sampleInput" << ndx << ";\n";
			else if (m_iteration == 1 || m_iteration == 4)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ", sampleInput" << ndx << ") + dot(21.0 * sampleInput" << ndx << ".xx, sin(3.1 * sampleInput" << ndx << "));\n";
			else if (m_iteration == 2)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ".xy, sampleInput" << ndx << ".xy) + dot(21.0 * sampleInput" << ndx << ".zx, sin(3.1 * sampleInput" << ndx << ".zy));\n";
			else if (m_iteration == 3)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ".xy, sampleInput" << ndx << ".zw) + dot(21.0 * sampleInput" << ndx << ".zy, sin(3.1 * sampleInput" << ndx << ".zw));\n";
			else
				DE_ASSERT(false);
		}
		buf <<	"\n";

		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
			buf <<	"	if (fract(field" << ndx << ") <= 0.5)\n"
					"		++coverage;\n";
	}
	else if (m_indexMode == INDEXING_DYNAMIC)
	{
		buf <<	"	for (int ndx = 0; ndx < " << numTargetSamples << "; ++ndx)\n"
				"	{\n";

		if (m_iteration == 0)
			buf <<	"		highp float sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 1)
			buf <<	"		highp vec2 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 2)
			buf <<	"		highp vec3 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 3)
			buf <<	"		highp vec4 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 4)
			buf <<	"		highp vec2 sampleInput = interpolateAtSample(v_input[1], (u_offset + ndx) % u_range);\n";
		else
			DE_ASSERT(false);

		if (m_iteration == 0)
			buf << "		highp float field = exp(sampleInput) + sampleInput*sampleInput;\n";
		else if (m_iteration == 1 || m_iteration == 4)
			buf << "		highp float field = dot(sampleInput, sampleInput) + dot(21.0 * sampleInput.xx, sin(3.1 * sampleInput));\n";
		else if (m_iteration == 2)
			buf << "		highp float field = dot(sampleInput.xy, sampleInput.xy) + dot(21.0 * sampleInput.zx, sin(3.1 * sampleInput.zy));\n";
		else if (m_iteration == 3)
			buf << "		highp float field = dot(sampleInput.xy, sampleInput.zw) + dot(21.0 * sampleInput.zy, sin(3.1 * sampleInput.zw));\n";
		else
			DE_ASSERT(false);

		buf <<	"		if (fract(field) <= 0.5)\n"
				"			++coverage;\n"
				"	}\n";
	}

	buf <<	"	fragColor = vec4(vec3(float(coverage) / float(" << numTargetSamples << ")), 1.0);\n"
			"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}